

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

LY_ERR searchpath_strcat(char **searchpaths,char *path)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *new;
  uint64_t len;
  char *path_local;
  char **searchpaths_local;
  
  if (*searchpaths == (char *)0x0) {
    pcVar1 = strdup(path);
    *searchpaths = pcVar1;
    searchpaths_local._4_4_ = LY_SUCCESS;
  }
  else {
    sVar2 = strlen(*searchpaths);
    sVar3 = strlen(path);
    pcVar1 = (char *)realloc(*searchpaths,sVar2 + sVar3 + 2);
    if (pcVar1 == (char *)0x0) {
      searchpaths_local._4_4_ = LY_EMEM;
    }
    else {
      strcat(pcVar1,":");
      strcat(pcVar1,path);
      *searchpaths = pcVar1;
      searchpaths_local._4_4_ = LY_SUCCESS;
    }
  }
  return searchpaths_local._4_4_;
}

Assistant:

LY_ERR
searchpath_strcat(char **searchpaths, const char *path)
{
    uint64_t len;
    char *new;

    if (!(*searchpaths)) {
        *searchpaths = strdup(path);
        return LY_SUCCESS;
    }

    len = strlen(*searchpaths) + strlen(path) + strlen(PATH_SEPARATOR);
    new = realloc(*searchpaths, sizeof(char) * len + 1);
    if (!new) {
        return LY_EMEM;
    }
    strcat(new, PATH_SEPARATOR);
    strcat(new, path);
    *searchpaths = new;

    return LY_SUCCESS;
}